

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdsmf.c
# Opt level: O1

int it_riff_dsmf_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len)

{
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  uint uVar4;
  int value;
  IT_ENTRY *entry;
  long lVar5;
  uint uVar6;
  bool bVar7;
  
  iVar1 = dumbfile_igetw(f);
  if (iVar1 <= len) {
    pattern->n_rows = 0x40;
    pattern->n_entries = 0x40;
    iVar2 = dumbfile_pos(f);
    lVar5 = (long)iVar1 + (long)iVar2 + -2;
    uVar6 = 0;
    bVar7 = true;
    do {
      while( true ) {
        iVar1 = dumbfile_error(f);
        if ((iVar1 != 0) || (iVar3 = dumbfile_pos(f), lVar5 <= iVar3)) goto LAB_006e8d1c;
        uVar4 = dumbfile_getc(f);
        if (uVar4 == 0) break;
        if ((uVar4 & 0xf0) != 0) {
          pattern->n_entries = pattern->n_entries + 1;
          if ((char)uVar4 < '\0') {
            dumbfile_skip(f,1);
          }
          if ((uVar4 & 0x40) != 0) {
            dumbfile_skip(f,1);
          }
          if ((uVar4 & 0x20) != 0) {
            dumbfile_skip(f,1);
          }
          if ((uVar4 & 0x10) != 0) {
            dumbfile_skip(f,2);
          }
        }
        if (!bVar7) goto LAB_006e8d1c;
      }
      bVar7 = uVar6 < 0x3f;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x40);
LAB_006e8d1c:
    if ((long)pattern->n_entries == 0x40) {
      return 0;
    }
    entry = (IT_ENTRY *)malloc((long)pattern->n_entries * 7);
    pattern->entry = entry;
    if (entry != (IT_ENTRY *)0x0) {
      uVar6 = 0;
      iVar1 = dumbfile_seek(f,(long)iVar2,0);
      if (iVar1 != 0) {
        return -1;
      }
      bVar7 = true;
      do {
        while( true ) {
          iVar1 = dumbfile_error(f);
          if ((iVar1 != 0) || (iVar2 = dumbfile_pos(f), lVar5 <= iVar2)) goto LAB_006e8e6d;
          uVar4 = dumbfile_getc(f);
          if (uVar4 == 0) break;
          entry->channel = (byte)uVar4 & 0xf;
          entry->mask = '\0';
          if ((uVar4 & 0xf0) != 0) {
            if (((char)(byte)uVar4 < '\0') && (iVar1 = dumbfile_getc(f), iVar1 != 0)) {
              entry->mask = entry->mask | 1;
              entry->note = (char)iVar1 + 0xff;
            }
            if (((uVar4 & 0x40) != 0) && (iVar1 = dumbfile_getc(f), iVar1 != 0)) {
              entry->mask = entry->mask | 2;
              entry->instrument = (uchar)iVar1;
            }
            if ((uVar4 & 0x20) != 0) {
              entry->mask = entry->mask | 4;
              iVar1 = dumbfile_getc(f);
              entry->volpan = (uchar)iVar1;
            }
            if ((uVar4 & 0x10) != 0) {
              iVar1 = dumbfile_getc(f);
              value = dumbfile_getc(f);
              _dumb_it_xm_convert_effect(iVar1,value,entry,0);
            }
            if (entry->mask != '\0') {
              entry = entry + 1;
            }
          }
          if (!bVar7) goto LAB_006e8e6d;
        }
        entry->channel = 0xff;
        entry = entry + 1;
        bVar7 = uVar6 < 0x3f;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x40);
      uVar6 = 0x40;
LAB_006e8e6d:
      if (uVar6 < 0x40) {
        iVar1 = uVar6 - 0x40;
        do {
          entry->channel = 0xff;
          entry = entry + 1;
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0);
      }
      iVar1 = ((int)entry - *(int *)&pattern->entry) * -0x49249249;
      pattern->n_entries = iVar1;
      return -(uint)(iVar1 == 0);
    }
  }
  return -1;
}

Assistant:

static int it_riff_dsmf_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len )
{
    int length, row;
	unsigned flags;
    long start, end;
    int p, q, r;
	IT_ENTRY * entry;

    length = dumbfile_igetw( f );
	if ( length > len ) return -1;

	len = length - 2;

	pattern->n_rows = 64;
	pattern->n_entries = 64;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < 64) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xF0;

		if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 1 );
            if (flags & 0x40) dumbfile_skip( f, 1 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
            if (flags & 0x10) dumbfile_skip( f, 2 );
		}
	}

	if ( pattern->n_entries == 64 ) return 0;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    if ( dumbfile_seek( f, start, DFS_SEEK_SET ) ) return -1;

    while ( ( row < 64 ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );
        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x0F;
		entry->mask = 0;

		if ( flags & 0xF0 )
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = q - 1;
				}
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
			}

			if ( flags & 0x20 )
			{
				entry->mask |= IT_ENTRY_VOLPAN;
                entry->volpan = dumbfile_getc( f );
			}

			if ( flags & 0x10 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( q, r, entry, 0 );
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < 64 )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}